

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O3

void __thiscall
tchecker::zg::details::global_m_extrapolation_t::global_m_extrapolation_t
          (global_m_extrapolation_t *this,
          shared_ptr<const_tchecker::clockbounds::global_m_map_t> *clock_bounds)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__global_m_extrapolation_t_00281cb8;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (clock_bounds->
         super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
  p_Var1 = (clock_bounds->
           super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

global_m_extrapolation_t::global_m_extrapolation_t(
    std::shared_ptr<tchecker::clockbounds::global_m_map_t const> const & clock_bounds)
    : _clock_bounds(clock_bounds)
{
}